

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

ostream * __thiscall
parser::ActionState::stringify(ActionState *this,ostream *out,NonTerminalNames *nonTerminalNames)

{
  ostream *poVar1;
  runtime_error *this_00;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  if ((ulong)this->action < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,&DAT_0012139c + *(int *)(&DAT_0012139c + (ulong)this->action * 4),1);
    std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
    std::ostream::operator<<((ostream *)out,this->state);
    if (this->nonTerminal == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
      nonTerminalName(&local_48,this->nonTerminal,nonTerminalNames);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_48._M_dataplus._M_p,local_48._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      out = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    return out;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"invalid action","");
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  *(undefined ***)this_00 = &PTR__runtime_error_00128bd8;
  __cxa_throw(this_00,&ParserError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::ostream& stringify(std::ostream& out, NonTerminalNames const& nonTerminalNames) const {
            out << "[" << (action == Shift ? "S" : action == Reduce ? "R" : action == Accept ? "A" : action == Error ? "E" : throw ParserError("invalid action"))
                << ", " << state;
            if (nonTerminal == Invalid)
                return out << "]";
            return out << ", "
                       << nonTerminalName(nonTerminal, nonTerminalNames) << ", "
                       << reduceCount  << "]";
        }